

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprNodeIsConstant(Walker *pWalker,Expr *pExpr)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  byte *in_RSI;
  Expr *in_RDI;
  Expr *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(short *)((long)&in_RDI->x + 4) == 2) && ((*(uint *)(in_RSI + 4) & 1) != 0)) {
    *(undefined2 *)((long)&in_RDI->x + 4) = 0;
    return 2;
  }
  uVar2 = (uint)*in_RSI;
  if (uVar2 == 0x3c) {
    iVar3 = sqlite3ExprIdToTrueFalse(in_stack_ffffffffffffffd8);
    if (iVar3 != 0) {
      return 1;
    }
  }
  else {
    if ((uVar2 == 0x48) || (uVar2 == 0x8e)) goto LAB_001d0d44;
    if (uVar2 == 0x9d) {
      if (*(short *)((long)&in_RDI->x + 4) == 5) {
        *in_RSI = 0x7a;
      }
      else if (*(short *)((long)&in_RDI->x + 4) == 4) {
        *(undefined2 *)((long)&in_RDI->x + 4) = 0;
        return 2;
      }
      return 0;
    }
    if (2 < uVar2 - 0xa8) {
      if (uVar2 == 0xac) {
        if (((3 < *(ushort *)((long)&in_RDI->x + 4)) || ((*(uint *)(in_RSI + 4) & 0x100000) != 0))
           && ((*(uint *)(in_RSI + 4) & 0x1000000) == 0)) {
          if (*(short *)((long)&in_RDI->x + 4) == 5) {
            *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x40000000;
          }
          return 0;
        }
        lVar1._0_1_ = in_RDI->op;
        lVar1._1_1_ = in_RDI->affExpr;
        lVar1._2_1_ = in_RDI->op2;
        lVar1._3_1_ = in_RDI->field_0x3;
        lVar1._4_4_ = in_RDI->flags;
        if (lVar1 == 0) {
          *(undefined2 *)((long)&in_RDI->x + 4) = 0;
          return 2;
        }
        iVar3 = exprNodeIsConstantFunction
                          ((Walker *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI);
        return iVar3;
      }
      if ((uVar2 != 0xb0) && (uVar2 != 0xb3)) {
        return 0;
      }
      goto LAB_001d0d44;
    }
  }
  if (((*(uint *)(in_RSI + 4) & 0x20) != 0) && (*(short *)((long)&in_RDI->x + 4) != 2)) {
    return 0;
  }
  if ((*(short *)((long)&in_RDI->x + 4) == 3) && (*(int *)(in_RSI + 0x2c) == in_RDI->nHeight)) {
    return 0;
  }
LAB_001d0d44:
  *(undefined2 *)((long)&in_RDI->x + 4) = 0;
  return 2;
}

Assistant:

static int exprNodeIsConstant(Walker *pWalker, Expr *pExpr){
  assert( pWalker->eCode>0 );

  /* If pWalker->eCode is 2 then any term of the expression that comes from
  ** the ON or USING clauses of an outer join disqualifies the expression
  ** from being considered constant. */
  if( pWalker->eCode==2 && ExprHasProperty(pExpr, EP_OuterON) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  switch( pExpr->op ){
    /* Consider functions to be constant if all their arguments are constant
    ** and either pWalker->eCode==4 or 5 or the function has the
    ** SQLITE_FUNC_CONST flag. */
    case TK_FUNCTION:
      if( (pWalker->eCode>=4 || ExprHasProperty(pExpr,EP_ConstFunc))
       && !ExprHasProperty(pExpr, EP_WinFunc)
      ){
        if( pWalker->eCode==5 ) ExprSetProperty(pExpr, EP_FromDDL);
        return WRC_Continue;
      }else if( pWalker->pParse ){
        return exprNodeIsConstantFunction(pWalker, pExpr);
      }else{
        pWalker->eCode = 0;
        return WRC_Abort;
      }
    case TK_ID:
      /* Convert "true" or "false" in a DEFAULT clause into the
      ** appropriate TK_TRUEFALSE operator */
      if( sqlite3ExprIdToTrueFalse(pExpr) ){
        return WRC_Prune;
      }
      /* no break */ deliberate_fall_through
    case TK_COLUMN:
    case TK_AGG_FUNCTION:
    case TK_AGG_COLUMN:
      testcase( pExpr->op==TK_ID );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_AGG_FUNCTION );
      testcase( pExpr->op==TK_AGG_COLUMN );
      if( ExprHasProperty(pExpr, EP_FixedCol) && pWalker->eCode!=2 ){
        return WRC_Continue;
      }
      if( pWalker->eCode==3 && pExpr->iTable==pWalker->u.iCur ){
        return WRC_Continue;
      }
      /* no break */ deliberate_fall_through
    case TK_IF_NULL_ROW:
    case TK_REGISTER:
    case TK_DOT:
    case TK_RAISE:
      testcase( pExpr->op==TK_REGISTER );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      testcase( pExpr->op==TK_DOT );
      testcase( pExpr->op==TK_RAISE );
      pWalker->eCode = 0;
      return WRC_Abort;
    case TK_VARIABLE:
      if( pWalker->eCode==5 ){
        /* Silently convert bound parameters that appear inside of CREATE
        ** statements into a NULL when parsing the CREATE statement text out
        ** of the sqlite_schema table */
        pExpr->op = TK_NULL;
      }else if( pWalker->eCode==4 ){
        /* A bound parameter in a CREATE statement that originates from
        ** sqlite3_prepare() causes an error */
        pWalker->eCode = 0;
        return WRC_Abort;
      }
      /* no break */ deliberate_fall_through
    default:
      testcase( pExpr->op==TK_SELECT ); /* sqlite3SelectWalkFail() disallows */
      testcase( pExpr->op==TK_EXISTS ); /* sqlite3SelectWalkFail() disallows */
      return WRC_Continue;
  }
}